

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::CommandLineInterface::WriteDescriptorSet
          (CommandLineInterface *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files)

{
  FileDescriptor *file_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  size_type sVar5;
  const_reference ppFVar6;
  RepeatedPtrField<google::protobuf::FileDescriptorProto> *output;
  char *pcVar7;
  int *piVar8;
  ostream *poVar9;
  undefined1 local_168 [8];
  FileOutputStream out;
  int local_10c;
  int fd;
  int i_2;
  _Self local_f8;
  _Self local_f0;
  FileDescriptor *local_e8;
  FileDescriptor *dependency;
  value_type pFStack_d8;
  int i_1;
  FileDescriptor *file;
  int i;
  FileDescriptor **local_c0;
  __normal_iterator<const_google::protobuf::FileDescriptor_*const_*,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
  local_b8;
  undefined1 local_b0 [8];
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  to_output;
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  already_seen;
  FileDescriptorSet file_set;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *parsed_files_local;
  CommandLineInterface *this_local;
  
  FileDescriptorSet::FileDescriptorSet
            ((FileDescriptorSet *)&already_seen._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::set((set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
         *)&to_output._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if ((this->imports_in_descriptor_set_ & 1U) == 0) {
    std::
    set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::set((set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
           *)local_b0);
    local_b8._M_current =
         (FileDescriptor **)
         std::
         vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
         ::begin(parsed_files);
    local_c0 = (FileDescriptor **)
               std::
               vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               ::end(parsed_files);
    std::
    set<google::protobuf::FileDescriptor_const*,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
    ::
    insert<__gnu_cxx::__normal_iterator<google::protobuf::FileDescriptor_const*const*,std::vector<google::protobuf::FileDescriptor_const*,std::allocator<google::protobuf::FileDescriptor_const*>>>>
              ((set<google::protobuf::FileDescriptor_const*,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
                *)local_b0,local_b8,
               (__normal_iterator<const_google::protobuf::FileDescriptor_*const_*,_std::vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>_>
                )local_c0);
    for (file._0_4_ = 0; uVar4 = (ulong)(int)file,
        sVar5 = std::
                vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                ::size(parsed_files), uVar4 < sVar5; file._0_4_ = (int)file + 1) {
      ppFVar6 = std::
                vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                ::operator[](parsed_files,(long)(int)file);
      pFStack_d8 = *ppFVar6;
      for (dependency._4_4_ = 0; iVar3 = dependency._4_4_,
          iVar2 = FileDescriptor::dependency_count(pFStack_d8), iVar3 < iVar2;
          dependency._4_4_ = dependency._4_4_ + 1) {
        local_e8 = FileDescriptor::dependency(pFStack_d8,dependency._4_4_);
        local_f0._M_node =
             (_Base_ptr)
             std::
             set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             ::find((set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                     *)local_b0,&local_e8);
        local_f8._M_node =
             (_Base_ptr)
             std::
             set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             ::end((set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                    *)local_b0);
        bVar1 = std::operator==(&local_f0,&local_f8);
        if (bVar1) {
          std::
          set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          ::insert((set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                    *)&to_output._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_e8);
        }
      }
    }
    std::
    set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::~set((set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            *)local_b0);
  }
  for (local_10c = 0;
      sVar5 = std::
              vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              ::size(parsed_files), (ulong)(long)local_10c < sVar5; local_10c = local_10c + 1) {
    ppFVar6 = std::
              vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              ::operator[](parsed_files,(long)local_10c);
    file_00 = *ppFVar6;
    bVar1 = this->source_info_in_descriptor_set_;
    output = FileDescriptorSet::mutable_file
                       ((FileDescriptorSet *)
                        &already_seen._M_t._M_impl.super__Rb_tree_header._M_node_count);
    GetTransitiveDependencies
              (file_00,true,(bool)(bVar1 & 1),
               (set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                *)&to_output._M_t._M_impl.super__Rb_tree_header._M_node_count,output);
  }
  do {
    pcVar7 = (char *)std::__cxx11::string::c_str();
    iVar3 = open(pcVar7,0x241,0x1b6);
    bVar1 = false;
    if (iVar3 < 0) {
      piVar8 = __errno_location();
      bVar1 = *piVar8 == 4;
    }
  } while (bVar1);
  if (iVar3 < 0) {
    pcVar7 = (char *)std::__cxx11::string::c_str();
    perror(pcVar7);
    this_local._7_1_ = false;
    out.impl_.buffer_used_ = 1;
  }
  else {
    io::FileOutputStream::FileOutputStream((FileOutputStream *)local_168,iVar3,-1);
    bVar1 = MessageLite::SerializeToZeroCopyStream
                      ((MessageLite *)&already_seen._M_t._M_impl.super__Rb_tree_header._M_node_count
                       ,(ZeroCopyOutputStream *)local_168);
    if (bVar1) {
      bVar1 = io::FileOutputStream::Close((FileOutputStream *)local_168);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        poVar9 = std::operator<<((ostream *)&std::cerr,(string *)&this->descriptor_set_name_);
        poVar9 = std::operator<<(poVar9,": ");
        iVar3 = io::FileOutputStream::GetErrno((FileOutputStream *)local_168);
        pcVar7 = strerror(iVar3);
        poVar9 = std::operator<<(poVar9,pcVar7);
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        this_local._7_1_ = false;
      }
    }
    else {
      poVar9 = std::operator<<((ostream *)&std::cerr,(string *)&this->descriptor_set_name_);
      poVar9 = std::operator<<(poVar9,": ");
      iVar3 = io::FileOutputStream::GetErrno((FileOutputStream *)local_168);
      pcVar7 = strerror(iVar3);
      poVar9 = std::operator<<(poVar9,pcVar7);
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      io::FileOutputStream::Close((FileOutputStream *)local_168);
      this_local._7_1_ = false;
    }
    out.impl_.buffer_used_ = 1;
    io::FileOutputStream::~FileOutputStream((FileOutputStream *)local_168);
  }
  std::
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::~set((set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *)&to_output._M_t._M_impl.super__Rb_tree_header._M_node_count);
  FileDescriptorSet::~FileDescriptorSet
            ((FileDescriptorSet *)&already_seen._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return this_local._7_1_;
}

Assistant:

bool CommandLineInterface::WriteDescriptorSet(
    const std::vector<const FileDescriptor*>& parsed_files) {
  FileDescriptorSet file_set;

  std::set<const FileDescriptor*> already_seen;
  if (!imports_in_descriptor_set_) {
    // Since we don't want to output transitive dependencies, but we do want
    // things to be in dependency order, add all dependencies that aren't in
    // parsed_files to already_seen.  This will short circuit the recursion
    // in GetTransitiveDependencies.
    std::set<const FileDescriptor*> to_output;
    to_output.insert(parsed_files.begin(), parsed_files.end());
    for (int i = 0; i < parsed_files.size(); i++) {
      const FileDescriptor* file = parsed_files[i];
      for (int i = 0; i < file->dependency_count(); i++) {
        const FileDescriptor* dependency = file->dependency(i);
        // if the dependency isn't in parsed files, mark it as already seen
        if (to_output.find(dependency) == to_output.end()) {
          already_seen.insert(dependency);
        }
      }
    }
  }
  for (int i = 0; i < parsed_files.size(); i++) {
    GetTransitiveDependencies(parsed_files[i],
                              true,  // Include json_name
                              source_info_in_descriptor_set_,
                              &already_seen, file_set.mutable_file());
  }

  int fd;
  do {
    fd = open(descriptor_set_name_.c_str(),
              O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, 0666);
  } while (fd < 0 && errno == EINTR);

  if (fd < 0) {
    perror(descriptor_set_name_.c_str());
    return false;
  }

  io::FileOutputStream out(fd);
  if (!file_set.SerializeToZeroCopyStream(&out)) {
    std::cerr << descriptor_set_name_ << ": " << strerror(out.GetErrno())
              << std::endl;
    out.Close();
    return false;
  }
  if (!out.Close()) {
    std::cerr << descriptor_set_name_ << ": " << strerror(out.GetErrno())
              << std::endl;
    return false;
  }

  return true;
}